

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

wchar_t variance(wchar_t *nums,wchar_t size,_Bool unbiased,_Bool of_mean,my_rational *frac)

{
  _Bool _Var1;
  uint16_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint16_t sz [2];
  uint16_t nm [2];
  uint16_t q [8];
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t r1 [6];
  uint16_t r0 [8];
  uint16_t w [3];
  uint16_t ss [6];
  uint16_t qcpy [6];
  uint16_t sqs [8];
  my_rational part;
  uint16_t r2 [6];
  
  if (size < L'\x02') {
    if (frac == (my_rational *)0x0) {
      return L'\0';
    }
    frac->n = 0;
    frac->d = 1;
    return L'\0';
  }
  uVar8 = size - (uint)unbiased;
  zer_u16n(ss,6);
  zer_u16n(sp,4);
  zer_u16n(sn,4);
  for (uVar9 = 0; (uint)size != uVar9; uVar9 = uVar9 + 1) {
    wVar3 = nums[uVar9];
    if (wVar3 != L'\0') {
      if (wVar3 < L'\x01') {
        _Var1 = ini_u16n(q,2,(wVar3 ^ 0x7fffffffU) + 0x80000001);
        if (_Var1) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x625,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(sn,q,4,2);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x626,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
      else {
        _Var1 = ini_u16n(q,2,wVar3);
        if (_Var1) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x622,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(sp,q,4,2);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x623,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
      _Var1 = mul_u16n(sqs,q,q,4,2,2);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x628,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      uVar2 = addip_u16n(ss,sqs,6,4);
      if (uVar2 != 0) {
        __assert_fail("carry == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x629,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
  }
  wVar3 = cmp_u16n(sp,sn,4,4);
  if (wVar3 < L'\0') {
    subip_u16n(sn,sp,4,4);
    _Var1 = mul_u16n(sqs,sn,sn,8,4,4);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x631,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
  }
  else {
    subip_u16n(sp,sn,4,4);
    _Var1 = mul_u16n(sqs,sp,sp,8,4,4);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x62e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
  }
  _Var1 = ini_u16n(sz,2,size);
  if (_Var1) {
    __assert_fail("!over",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x633,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  wVar3 = div_u16n(q,r0,w,sqs,sz,8,8,2);
  if (wVar3 != L'\0') {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x636,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  sVar6 = msb_u16n(r0,8);
  if (sVar6 != 0) {
    _Var1 = ini_u16n(r1,2,1);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x640,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    addip_u16n(q,r1,8,2);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      r1[lVar7] = r0[lVar7];
    }
    _Var1 = ini_u16n(r0,8,size);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x645,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    wVar3 = cmp_u16n(r0,r1,8,8);
    if (wVar3 < L'\x01') {
      __assert_fail("cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x646,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    subip_u16n(r0,r1,8,8);
  }
  wVar3 = cmp_u16n(ss,q,6,8);
  if (wVar3 < L'\0') {
    __assert_fail("cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x649,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  subip_u16n(ss,q,6,8);
  _Var1 = ini_u16n(nm,2,uVar8);
  if (!_Var1) {
    wVar3 = div_u16n(q,r1,w,ss,nm,6,6,2);
    if (wVar3 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x64e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    if (of_mean) {
      for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
        qcpy[lVar7] = q[lVar7];
      }
      wVar3 = div_u16n(q,r2,w,qcpy,sz,6,6,2);
      if (wVar3 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x657,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    sVar6 = msb_u16n(q,6);
    if ((sVar6 < 0x21) && (wVar3 = ext_u16n(q,6), L'\xffffffff' < wVar3)) {
      wVar4 = cmp_u16n(sz,r0,2,8);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x66f,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      wVar4 = cmp_u16n(nm,r1,2,6);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x670,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      if ((of_mean) && (wVar4 = cmp_u16n(sz,r2,2,6), wVar4 < L'\x01')) {
        __assert_fail("!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x671,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      uVar5 = ext_u16n(r0,8);
      qcpy._0_8_ = my_rational_construct(uVar5,size);
      part = my_rational_construct(1,uVar8);
      qcpy._0_8_ = my_rational_product((my_rational *)qcpy,&part);
      uVar5 = ext_u16n(r1,6);
      part = my_rational_construct(uVar5,uVar8);
      qcpy._0_8_ = my_rational_sum((my_rational *)qcpy,&part);
      if (of_mean) {
        part = my_rational_construct(1,size);
        qcpy._0_8_ = my_rational_product((my_rational *)qcpy,&part);
        uVar8 = ext_u16n(r2,6);
        part = my_rational_construct(uVar8,size);
        qcpy._0_8_ = my_rational_sum((my_rational *)qcpy,&part);
      }
      if (frac == (my_rational *)0x0) {
        return wVar3 + (uint)(wVar3 != L'\x7fffffff' &&
                             SUB84(qcpy._0_8_,4) + 1 >> 1 <= (uint)qcpy._0_8_);
      }
    }
    else {
      wVar3 = L'\x7fffffff';
      if (frac == (my_rational *)0x0) {
        return L'\x7fffffff';
      }
      qcpy._0_4_ = 0;
      qcpy._4_4_ = 1;
    }
    *frac = (my_rational)qcpy._0_8_;
    return wVar3;
  }
  __assert_fail("!over",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c",
                0x64b,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
}

Assistant:

int variance(const int *nums, int size, bool unbiased, bool of_mean,
		struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * The unbiased variance estimator, sum((nums[i] - sum(nums[i]) /
	 * size)^2) / (size - 1), is equivalent to (sum(nums[i]^2) -
	 * (sum(nums[i]))^2 / size) / (size - 1).  Store sum(nums[i]^2) in
	 * ss, the positive contributions to sum(nums[i]) in sp, and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t ss[3 * MP_DIGITS], sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t sqs[4 * MP_DIGITS];
	uint16_t q[4 * MP_DIGITS], r0[4 * MP_DIGITS], r1[3 * MP_DIGITS];
	uint16_t r2[3 * MP_DIGITS];
	uint16_t sz[MP_DIGITS], nm[MP_DIGITS], w[MP_DIGITS + 1];
	struct my_rational f, part;
	unsigned int var;
	int norm, i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 1) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	norm = size - ((unbiased) ? 1 : 0);
	zer_u16n(ss, N_ELEMENTS(ss));
	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t a[MP_DIGITS], a2[2 * MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), nums[i]));
			CHECK_CARRY(addip_u16n(sp, a, N_ELEMENTS(sp), N_ELEMENTS(a)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, a, N_ELEMENTS(sn), N_ELEMENTS(a)));
		}
		CHECK_OVERFLOW(mul_u16n(a2, a, a, N_ELEMENTS(a2), N_ELEMENTS(a), N_ELEMENTS(a)));
		CHECK_CARRY(addip_u16n(ss, a2, N_ELEMENTS(ss), N_ELEMENTS(a2)));
	}

	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) >= 0) {
		subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
		CHECK_OVERFLOW(mul_u16n(sqs, sp, sp, N_ELEMENTS(sqs), N_ELEMENTS(sp), N_ELEMENTS(sp)));
	} else {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		CHECK_OVERFLOW(mul_u16n(sqs, sn, sn, N_ELEMENTS(sqs), N_ELEMENTS(sn), N_ELEMENTS(sn)));
	}
	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	i = div_u16n(q, r0, w, sqs, sz, N_ELEMENTS(q), N_ELEMENTS(sqs),
		N_ELEMENTS(sz));
	assert(i == 0);
	if (msb_u16n(r0, N_ELEMENTS(r0)) > 0) {
		/*
		 * Since this remainder is subtracted, add one to the
		 * quotient and convert the remainder to size - r0.  That way
		 * later calculations can treat it as a non-negative term, like
		 * the other fractional parts.
		 */
		uint16_t tmp[4 * MP_DIGITS];

		CHECK_OVERFLOW(ini_u16n(tmp, MP_DIGITS, 1));
		addip_u16n(q, tmp, N_ELEMENTS(q), MP_DIGITS);
		for (i = 0; i < (int)(N_ELEMENTS(r0)); ++i) {
			tmp[i] = r0[i];
		}
		CHECK_OVERFLOW(ini_u16n(r0, N_ELEMENTS(r0), size));
		assert(cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0);
		subip_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp));
	}
	assert(cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0);
	subip_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q));
	CHECK_OVERFLOW(ini_u16n(nm, N_ELEMENTS(nm), norm));
	i = div_u16n(q, r1, w, ss, nm, 3 * MP_DIGITS, N_ELEMENTS(ss),
		N_ELEMENTS(nm));
	assert(i == 0);
	if (of_mean) {
		uint16_t qcpy[3 * MP_DIGITS];

		for (i = 0; i < (int)(N_ELEMENTS(qcpy)); ++i) {
			qcpy[i] = q[i];
		}
		i = div_u16n(q, r2, w, qcpy, sz, 3 * MP_DIGITS,
			N_ELEMENTS(qcpy), N_ELEMENTS(sz));
		assert(i == 0);
	}
	if (msb_u16n(q, 3 * MP_DIGITS) > CHAR_BIT * sizeof(unsigned int)) {
		/* Variance is greater than UINT_MAX. */
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	var = ext_u16n(q, 3 * MP_DIGITS);
	if (var > INT_MAX) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	/*
	 * Account for the fractional part.  If of_mean is false, that is
	 * r1 / norm + r0 / (size * norm).  If of_mean is true,
	 * that is r2 / size + r1 / (size * norm) + r0 /
	 * (size * size * norm).  Since 0 <= r0 < size,
	 * 0 <= r1 < norm, and 0 <= r2 < size, the total of the fractional
	 * terms is greater than or equal to zero and less than one.
	 */
	assert(cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0);
	assert(cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0);
	assert(!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0);
	f = my_rational_construct(ext_u16n(r0, N_ELEMENTS(r0)), size);
	part = my_rational_construct(1, norm);
	f = my_rational_product(&f, &part);
	part = my_rational_construct(ext_u16n(r1, N_ELEMENTS(r1)), norm);
	f = my_rational_sum(&f, &part);
	if (of_mean) {
		part = my_rational_construct(1, size);
		f = my_rational_product(&f, &part);
		part = my_rational_construct(ext_u16n(r2, N_ELEMENTS(r2)), size);
		f = my_rational_sum(&f, &part);
	}
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2 && var < INT_MAX) {
			++var;
		}
	}

	return var;
#undef MP_DIGITS
#undef CHECK_CARRY
#undef CHECK_OVERFLOW
}